

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall LTAircraft::SetVisible(LTAircraft *this,bool b)

{
  char *szMsg;
  
  this->bAutoVisible = false;
  this->bSetVisible = b;
  if ((bool)((this->super_Aircraft).bValid & (this->super_Aircraft).bVisible) != b) {
    XPMP2::Aircraft::SetVisible(&this->super_Aircraft,b);
    if ((int)dataRefs.iLogLevel < 2) {
      szMsg = "A/c %s hidden";
      if (((this->super_Aircraft).bVisible & (this->super_Aircraft).bValid) != 0) {
        szMsg = "A/c %s visible";
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
             ,0x9db,"SetVisible",logINFO,szMsg,(this->labelInternal)._M_dataplus._M_p);
      return;
    }
  }
  return;
}

Assistant:

void LTAircraft::SetVisible (bool b)
{
    bAutoVisible = false;
    bSetVisible = b;
    if (b != IsVisible())       // is new visibility a change?
    {
        XPMP2::Aircraft::SetVisible(b);
        LOG_MSG(logINFO, IsVisible() ? INFO_AC_SHOWN : INFO_AC_HIDDEN,
                labelInternal.c_str());
    }
}